

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdom.cpp
# Opt level: O0

void qt_split_namespace(QString *prefix,QString *name,QString *qName,bool hasURI)

{
  byte bVar1;
  QString *this;
  byte in_CL;
  QString *in_RDX;
  QString *in_RSI;
  long in_FS_OFFSET;
  qsizetype i;
  qsizetype in_stack_ffffffffffffff80;
  undefined7 in_stack_ffffffffffffff88;
  QString *size;
  undefined1 local_58 [6];
  QChar in_stack_ffffffffffffffae;
  QChar local_a;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  bVar1 = in_CL & 1;
  size = in_RDX;
  QChar::QChar<char16_t,_true>(&local_a,L':');
  this = (QString *)
         QString::indexOf((QString *)CONCAT17(bVar1,in_stack_ffffffffffffff88),
                          in_stack_ffffffffffffffae,in_stack_ffffffffffffff80,
                          (CaseSensitivity)((ulong)in_RDX >> 0x20));
  if (this == (QString *)0xffffffffffffffff) {
    if ((bVar1 & 1) == 0) {
      QString::clear((QString *)0xffffffffffffffff);
    }
    else {
      Qt::Literals::StringLiterals::operator____s((char16_t *)in_RSI,(size_t)size);
      QString::operator=(this,in_RDX);
      QString::~QString((QString *)0x114e30);
    }
    QString::operator=(in_RSI,(QString *)size);
  }
  else {
    QString::left(in_RSI,(qsizetype)size);
    QString::operator=(this,in_RDX);
    QString::~QString((QString *)0x114e7a);
    QString::mid((longlong)local_58,(longlong)size);
    QString::operator=(this,in_RDX);
    QString::~QString((QString *)0x114eb2);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

static void qt_split_namespace(QString& prefix, QString& name, const QString& qName, bool hasURI)
{
    qsizetype i = qName.indexOf(u':');
    if (i == -1) {
        if (hasURI)
            prefix = u""_s;
        else
            prefix.clear();
        name = qName;
    } else {
        prefix = qName.left(i);
        name = qName.mid(i + 1);
    }
}